

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentdelete.cpp
# Opt level: O3

void delete_elements(DuckDB *db,bool *correct,size_t threadnr)

{
  ulong __val;
  bool bVar1;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var2;
  MaterializedQueryResult *pMVar3;
  char cVar4;
  char cVar5;
  pointer pMVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  string __str;
  Value new_count;
  Connection con;
  Value count;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_130;
  size_t local_128;
  long *local_120;
  bool *local_118;
  MaterializedQueryResult *local_110;
  uint local_108;
  MaterializedQueryResult local_100 [16];
  long *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  Connection local_90 [32];
  undefined1 *local_70 [2];
  undefined1 local_60 [48];
  
  correct[threadnr] = true;
  local_128 = threadnr;
  local_118 = correct;
  duckdb::Connection::Connection(local_90,db);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"BEGIN TRANSACTION;","");
  duckdb::Connection::Query((string *)&local_e8);
  if (local_e8 != (long *)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_e8 = (long *)0x0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"SELECT COUNT(*) FROM integers","");
  duckdb::Connection::Query((string *)&local_130);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  pMVar6 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_130);
  duckdb::MaterializedQueryResult::GetValue((ulong)local_70,(ulong)pMVar6);
  local_e0 = duckdb::Value::GetValue<long>();
  local_d8 = local_128 * 100;
  uVar10 = 0;
  do {
    __val = local_d8 + uVar10;
    cVar5 = '\x01';
    if (9 < __val) {
      uVar8 = __val;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar8 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0043c00d;
        }
        if (uVar8 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0043c00d;
        }
        if (uVar8 < 10000) goto LAB_0043c00d;
        bVar1 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar1);
      cVar5 = cVar5 + '\x01';
    }
LAB_0043c00d:
    local_110 = local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_110,local_108,__val);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x4ea431);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_c0 = *plVar9;
      lStack_b8 = plVar7[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar9;
      local_d0 = (long *)*plVar7;
    }
    local_c8 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    duckdb::Connection::Query((string *)&local_120);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_120);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_120 != (long *)0x0) {
      (**(code **)(*local_120 + 8))();
    }
    local_120 = (long *)0x0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (cVar5 != '\0') {
      local_118[local_128] = false;
    }
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"SELECT COUNT(*) FROM integers","");
    duckdb::Connection::Query((string *)&local_110);
    pMVar3 = local_110;
    _Var2._M_head_impl = local_130._M_head_impl;
    local_110 = (MaterializedQueryResult *)0x0;
    local_130._M_head_impl = pMVar3;
    if (_Var2._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
      if (local_110 != (MaterializedQueryResult *)0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    local_110 = (MaterializedQueryResult *)0x0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_130);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (cVar5 == '\0') {
      pMVar6 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)&local_130);
      duckdb::MaterializedQueryResult::GetValue((ulong)&local_d0,(ulong)pMVar6);
      local_110 = (MaterializedQueryResult *)(~uVar10 + local_e0);
      cVar5 = duckdb::Value::operator!=((Value *)&local_d0,(long *)&local_110);
      if (cVar5 != '\0') {
        local_118[local_128] = false;
      }
      duckdb::Value::operator=((Value *)local_70,(Value *)&local_d0);
      duckdb::Value::~Value((Value *)&local_d0);
    }
    else {
      local_118[local_128] = false;
    }
    uVar10 = uVar10 + 1;
    if (uVar10 == 100) {
      LOCK();
      delete_finished_threads.super___atomic_base<int>._M_i =
           (__atomic_base<int>)((int)delete_finished_threads.super___atomic_base<int>._M_i + 1);
      UNLOCK();
      do {
      } while (delete_finished_threads.super___atomic_base<int>._M_i != 10);
      local_d0 = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"COMMIT;","");
      duckdb::Connection::Query((string *)&local_f0);
      if (local_f0 != (long *)0x0) {
        (**(code **)(*local_f0 + 8))();
      }
      local_f0 = (long *)0x0;
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      duckdb::Value::~Value((Value *)local_70);
      if (local_130._M_head_impl != (MaterializedQueryResult *)0x0) {
        (**(code **)(*(long *)local_130._M_head_impl + 8))();
      }
      duckdb::Connection::~Connection(local_90);
      return;
    }
  } while( true );
}

Assistant:

static void delete_elements(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();

	for (size_t i = 0; i < CONCURRENT_DELETE_INSERT_ELEMENTS; i++) {
		// count should decrease by one for every delete we do
		auto element = CONCURRENT_DELETE_INSERT_ELEMENTS * threadnr + i;
		if (con.Query("DELETE FROM integers WHERE i=" + to_string(element))->HasError()) {
			correct[threadnr] = false;
		}
		result = con.Query("SELECT COUNT(*) FROM integers");
		if (result->HasError()) {
			correct[threadnr] = false;
		} else {
			Value new_count = result->GetValue(0, 0);
			if (new_count != start_count - (i + 1)) {
				correct[threadnr] = false;
			}
			count = new_count;
		}
	}
	delete_finished_threads++;
	while (delete_finished_threads != CONCURRENT_DELETE_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}